

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phf.cc
# Opt level: O0

int phf_keycmp<unsigned_long>(phf_key<unsigned_long> *a,phf_key<unsigned_long> *b)

{
  phf_key<unsigned_long> *b_local;
  phf_key<unsigned_long> *a_local;
  
  if (*b->n < *a->n) {
    a_local._4_4_ = -1;
  }
  else if (*a->n < *b->n) {
    a_local._4_4_ = 1;
  }
  else if (b->g < a->g) {
    a_local._4_4_ = -1;
  }
  else if (a->g < b->g) {
    a_local._4_4_ = 1;
  }
  else {
    if ((a->k == b->k) && (a != b)) {
      if (a->k == b->k) {
        __assert_fail("!(a->k == b->k)",
                      "/workspace/llm4binary/github/license_c_cmakelists/bakwc[P]JamSpell/contrib/phf/phf.cc"
                      ,0x1e4,
                      "int phf_keycmp(const phf_key<T> *, const phf_key<T> *) [T = unsigned long]");
      }
      abort();
    }
    a_local._4_4_ = 0;
  }
  return a_local._4_4_;
}

Assistant:

static int phf_keycmp(const phf_key<T> *a, const phf_key<T> *b) {
	if (*(a->n) > *(b->n))
		return -1;
	if (*(a->n) < *(b->n))
		return 1;
	if (a->g > b->g)
		return -1;
	if (a->g < b->g)
		return 1;

	/* duplicate key? */
	if (a->k == b->k && a != b) {
		assert(!(a->k == b->k));
		abort(); /* if NDEBUG defined */
	}

	return 0;
}